

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Operand * translateLiteral(Operand *__return_storage_ptr__,Operand *reg)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  const_reference this;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string_type local_150;
  int local_12c;
  undefined1 local_128 [4];
  int index;
  undefined1 local_108 [8];
  smatch match;
  size_t pos;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_a8 [39];
  allocator<char> local_81;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  char *local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  string local_58 [32];
  string local_38 [8];
  string new_string;
  Operand *reg_local;
  
  new_string.field_2._8_8_ = reg;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value);
  if (*pcVar3 == '$') {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value);
    iVar2 = isdigit((int)*pcVar3);
    if (iVar2 != 0) {
      iVar2 = parse_8bit_literal(&reg->value);
      literal(__return_storage_ptr__,iVar2);
      return __return_storage_ptr__;
    }
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value);
  if ((*pcVar3 == '.') ||
     ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value), *pcVar3 == '$' &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value), *pcVar3 == '.')))) {
    std::__cxx11::string::string(local_38);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&reg->value);
    if (*pcVar3 == '$') {
      local_68 = (char *)std::__cxx11::string::begin();
      local_60 = std::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             )local_68,1);
      local_80._M_current = (char *)std::__cxx11::string::end();
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_58,local_60,local_80,&local_81);
      std::__cxx11::string::operator=(local_38,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_81);
    }
    else {
      local_b0._M_current = (char *)std::__cxx11::string::begin();
      local_b8._M_current = (char *)std::__cxx11::string::end();
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_a8,local_b0,local_b8,(allocator<char> *)((long)&pos + 7));
      std::__cxx11::string::operator=(local_38,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
    }
    while (uVar4 = std::__cxx11::string::find((char *)local_38,0x13e5a5),
          uVar4 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)local_38,uVar4,(char *)0x1);
    }
    std::__cxx11::string::string((string *)&match._M_begin,local_38);
    literal(__return_storage_ptr__,(string *)&match._M_begin);
    std::__cxx11::string::~string((string *)&match._M_begin);
    std::__cxx11::string::~string(local_38);
  }
  else {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_108);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_128,"(\\d+)\\(%esp\\)",
               0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&reg->value,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_108,
                       (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_128,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_128);
    if (bVar1) {
      this = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_108,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_150,(sub_match *)this);
      iVar2 = std::__cxx11::stoi(&local_150,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_150);
      local_12c = iVar2 / 2;
      std::__cxx11::to_string(&local_1b0,iVar2 / 2);
      std::operator+(&local_190,"(ix + ",&local_1b0);
      std::operator+(&local_170,&local_190,")");
      literal(__return_storage_ptr__,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    else {
      Operand::Operand(__return_storage_ptr__,reg);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

static Operand translateLiteral(const Operand reg) {
	// Number
	if (reg.value[0] == '$') {
		if (isdigit(reg.value[1])) {
			return literal(parse_8bit_literal(reg.value));
		}
	}
	if (reg.value[0] == '.' || (reg.value[0] =='$' && reg.value[1] == '.')) {
		std::string new_string;
		if (reg.value[0] == '$')
			new_string = std::string(std::next(reg.value.begin()), reg.value.end());
		else
			new_string = std::string(reg.value.begin(), reg.value.end());
		std::size_t pos;
		while ((pos = new_string.find(".")) != std::string::npos) {
			new_string.replace(pos, 1, "period_");
		}
		return literal(new_string);
	}
	std::smatch match;
	if (std::regex_match(reg.value, match, std::regex(R"((\d+)\(%esp\))"))) {
		// This is a stack index (e.g. "16(%esp)"). Convert this to a z80 index.
		int index = std::stoi(match[1]) / 2;
		return literal("(ix + " + std::to_string(index) + ")");
	}
	return reg;
}